

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait.cpp
# Opt level: O0

DWORD CorUnix::InternalWaitForMultipleObjectsEx
                (CPalThread *pThread,DWORD nCount,HANDLE *lpHandles,BOOL bWaitAll,
                DWORD dwMilliseconds,BOOL bAlertable)

{
  ulong uVar1;
  bool bVar2;
  bool local_17f;
  bool local_17e;
  undefined4 local_17c;
  WaitType local_178;
  ThreadWakeupReason twrWakeupReason;
  int iEndIdx;
  int iStartIdx;
  bool fValue;
  ISynchWaitController *pIStack_168;
  DWORD j;
  IPalObject *objectToCheck;
  ISynchWaitController **ppIStack_158;
  DWORD i_1;
  ISynchWaitController **ppISyncWaitCtrlrs;
  IPalObject **ppIPalObjs;
  ISynchWaitController *pISyncStackArray [16];
  IPalObject *pIPalObjStackArray [16];
  WaitType wtWaitType;
  bool fAbandoned;
  bool fNeedToBlock;
  uint uStack_3c;
  bool fWAll;
  int iSignaledObjIndex;
  int iSignaledObjCount;
  int i;
  PAL_ERROR palErr;
  DWORD dwRet;
  BOOL bAlertable_local;
  DWORD dwMilliseconds_local;
  BOOL bWaitAll_local;
  HANDLE *lpHandles_local;
  CPalThread *pCStack_10;
  DWORD nCount_local;
  CPalThread *pThread_local;
  
  i = -1;
  iSignaledObjCount = 0;
  wtWaitType = ~SingleObject;
  pIPalObjStackArray[0xf]._7_1_ = bWaitAll != 0;
  pIPalObjStackArray[0xf]._6_1_ = 0;
  pIPalObjStackArray[0xf]._5_1_ = 0;
  palErr = bAlertable;
  dwRet = dwMilliseconds;
  bAlertable_local = bWaitAll;
  _dwMilliseconds_local = lpHandles;
  lpHandles_local._4_4_ = nCount;
  pCStack_10 = pThread;
  memset(pISyncStackArray + 0xf,0,0x80);
  memset(&ppIPalObjs,0,0x80);
  ppISyncWaitCtrlrs = pISyncStackArray + 0xf;
  ppIStack_158 = (ISynchWaitController **)&ppIPalObjs;
  if ((lpHandles_local._4_4_ == SingleObject) || (0x40 < lpHandles_local._4_4_)) {
    ppISyncWaitCtrlrs = (ISynchWaitController **)0x0;
    ppIStack_158 = (ISynchWaitController **)0x0;
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    CPalThread::SetLastError(0x57);
    goto LAB_003c76ca;
  }
  if (lpHandles_local._4_4_ == MultipleObjectsWaitOne) {
    pIPalObjStackArray[0xf]._7_1_ = 0;
    pIPalObjStackArray[0xf]._0_4_ = 0;
  }
  else {
    pIPalObjStackArray[0xf]._0_4_ = 1;
    if ((pIPalObjStackArray[0xf]._7_1_ & 1) != 0) {
      pIPalObjStackArray[0xf]._0_4_ = 2;
    }
    if (0x10 < lpHandles_local._4_4_) {
      ppISyncWaitCtrlrs =
           (ISynchWaitController **)
           InternalNewArray<CorUnix::IPalObject*>((ulong)lpHandles_local._4_4_);
      ppIStack_158 = InternalNewArray<CorUnix::ISynchWaitController*>((ulong)lpHandles_local._4_4_);
      if ((ppISyncWaitCtrlrs == (ISynchWaitController **)0x0) ||
         (ppIStack_158 == (ISynchWaitController **)0x0)) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        CPalThread::SetLastError(8);
        goto LAB_003c76ca;
      }
    }
  }
  iSignaledObjCount =
       (**(code **)(*g_pObjectManager + 0x30))
                 (g_pObjectManager,pCStack_10,_dwMilliseconds_local,lpHandles_local._4_4_,
                  &sg_aotWaitObject,0x100000,ppISyncWaitCtrlrs);
  if (iSignaledObjCount != 0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    if (iSignaledObjCount == 6) {
      CPalThread::SetLastError(6);
    }
    else {
      CPalThread::SetLastError(0x54f);
    }
    goto LAB_003c76ca;
  }
  if ((pIPalObjStackArray[0xf]._7_1_ & 1) != 0) {
    for (objectToCheck._4_4_ = 0;
        objectToCheck._4_4_ < lpHandles_local._4_4_ - MultipleObjectsWaitOne;
        objectToCheck._4_4_ = objectToCheck._4_4_ + 1) {
      pIStack_168 = ppISyncWaitCtrlrs[objectToCheck._4_4_];
      iStartIdx = objectToCheck._4_4_;
      while (iStartIdx = iStartIdx + 1, (uint)iStartIdx < lpHandles_local._4_4_) {
        if (ppISyncWaitCtrlrs[(uint)iStartIdx] == pIStack_168) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          CPalThread::SetLastError(0x57);
          goto LAB_003c7682;
        }
      }
    }
  }
  iSignaledObjCount =
       (**(code **)(*g_pSynchronizationManager + 0x28))
                 (g_pSynchronizationManager,pCStack_10,ppISyncWaitCtrlrs,lpHandles_local._4_4_,
                  ppIStack_158);
  if (iSignaledObjCount == 0) {
    if ((palErr == 0) ||
       (uVar1 = (**(code **)(*g_pSynchronizationManager + 0x18))
                          (g_pSynchronizationManager,pCStack_10), (uVar1 & 1) == 0)) {
      uStack_3c = 0;
      wtWaitType = ~SingleObject;
      for (iSignaledObjIndex = 0; iSignaledObjIndex < (int)lpHandles_local._4_4_;
          iSignaledObjIndex = iSignaledObjIndex + 1) {
        iSignaledObjCount =
             (**ppIStack_158[iSignaledObjIndex]->_vptr_ISynchWaitController)
                       (ppIStack_158[iSignaledObjIndex],(long)&iEndIdx + 3,
                        (long)pIPalObjStackArray + 0x7d);
        if (iSignaledObjCount != 0) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          CPalThread::SetLastError(0x54f);
          goto LAB_003c739e;
        }
        if ((iEndIdx._3_1_ & 1) != 0) {
          uStack_3c = uStack_3c + 1;
          wtWaitType = iSignaledObjIndex;
          if ((pIPalObjStackArray[0xf]._7_1_ & 1) == 0) break;
        }
      }
      local_17e = true;
      if (uStack_3c != 0) {
        local_17f = (pIPalObjStackArray[0xf]._7_1_ & 1) != 0 &&
                    (int)uStack_3c < (int)lpHandles_local._4_4_;
        local_17e = local_17f;
      }
      pIPalObjStackArray[0xf]._6_1_ = local_17e;
      if (local_17e == false) {
        if ((pIPalObjStackArray[0xf]._7_1_ & 1) == 0) {
          twrWakeupReason = wtWaitType;
          local_178 = wtWaitType + MultipleObjectsWaitOne;
        }
        else {
          twrWakeupReason = WaitSucceeded;
          local_178 = lpHandles_local._4_4_;
        }
        if ((int)twrWakeupReason < 0) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          CPalThread::SetLastError(0x54f);
          i = -1;
          goto LAB_003c7682;
        }
        for (iSignaledObjIndex = twrWakeupReason; iSignaledObjIndex < (int)local_178;
            iSignaledObjIndex = iSignaledObjIndex + 1) {
          iSignaledObjCount = (*ppIStack_158[iSignaledObjIndex]->_vptr_ISynchWaitController[1])();
          if (iSignaledObjCount != 0) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            CPalThread::SetLastError(iSignaledObjCount);
            goto LAB_003c739e;
          }
        }
        i = 0;
        if ((pIPalObjStackArray[0xf]._5_1_ & 1) != 0) {
          i = 0x80;
        }
      }
      else if (dwRet == 0) {
        i = 0x102;
        pIPalObjStackArray[0xf]._6_1_ = 0;
      }
      else {
        for (iSignaledObjIndex = 0; iSignaledObjIndex < (int)lpHandles_local._4_4_;
            iSignaledObjIndex = iSignaledObjIndex + 1) {
          iSignaledObjCount =
               (*ppIStack_158[iSignaledObjIndex]->_vptr_ISynchWaitController[2])
                         (ppIStack_158[iSignaledObjIndex],(ulong)(uint)pIPalObjStackArray[0xf],
                          (ulong)(uint)iSignaledObjIndex,(ulong)(palErr == 1));
          if (iSignaledObjCount != 0) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            CPalThread::SetLastError(iSignaledObjCount);
            break;
          }
        }
      }
LAB_003c739e:
      for (iSignaledObjIndex = 0; iSignaledObjIndex < (int)lpHandles_local._4_4_;
          iSignaledObjIndex = iSignaledObjIndex + 1) {
        (*ppIStack_158[iSignaledObjIndex]->_vptr_ISynchWaitController[3])();
        ppIStack_158[iSignaledObjIndex] = (ISynchWaitController *)0x0;
      }
      if (iSignaledObjCount == 0) {
        if ((pIPalObjStackArray[0xf]._6_1_ & 1) != 0) {
          iSignaledObjCount =
               (**(code **)*g_pSynchronizationManager)
                         (g_pSynchronizationManager,pCStack_10,dwRet,palErr == 1,0,&local_17c,
                          &wtWaitType);
          if (iSignaledObjCount != 0) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            CPalThread::SetLastError(iSignaledObjCount);
            goto LAB_003c7682;
          }
          switch(local_17c) {
          case 0:
            i = 0;
            break;
          case 1:
            if (palErr == 0) {
              fprintf(_stderr,"] %s %s:%d","InternalWaitForMultipleObjectsEx",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
                      ,0x21e);
              fprintf(_stderr,
                      "Expression: bAlertable, Description: Awakened for APC from a non-alertable wait\n"
                     );
            }
            i = 0xc0;
            iSignaledObjCount =
                 (**(code **)(*g_pSynchronizationManager + 0x20))
                           (g_pSynchronizationManager,pCStack_10);
            if (iSignaledObjCount != 0) {
              fprintf(_stderr,"] %s %s:%d","InternalWaitForMultipleObjectsEx",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
                      ,0x224);
              fprintf(_stderr,
                      "Expression: NO_ERROR == palErr, Description: Awakened for APC, but no APC is pending\n"
                     );
            }
            break;
          case 2:
            i = 0x80;
            break;
          case 3:
            i = 0x102;
            break;
          case 4:
          default:
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            i = -1;
          }
        }
        if (((pIPalObjStackArray[0xf]._7_1_ & 1) == 0) && ((i == 0 || (i == 0x80)))) {
          if ((int)wtWaitType < 0) {
            fprintf(_stderr,"] %s %s:%d","InternalWaitForMultipleObjectsEx",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
                    ,0x231);
            fprintf(_stderr,
                    "Expression: 0 <= iSignaledObjIndex, Description: Failed to identify signaled/abandoned object\n"
                   );
          }
          if (((int)wtWaitType < 0) || (lpHandles_local._4_4_ <= wtWaitType)) {
            fprintf(_stderr,"] %s %s:%d","InternalWaitForMultipleObjectsEx",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
                    ,0x235);
            fprintf(_stderr,
                    "Expression: iSignaledObjIndex >= 0 && nCount > static_cast<DWORD>(iSignaledObjIndex), Description: SignaledObjIndex object out of range [index=%d obj_count=%u\n"
                    ,(ulong)uStack_3c,(ulong)lpHandles_local._4_4_);
          }
          if ((int)wtWaitType < 0) {
            CPalThread::SetLastError(0x54f);
            i = -1;
          }
          else {
            i = wtWaitType + i;
          }
        }
      }
    }
    else {
      iSignaledObjIndex = 0;
      while( true ) {
        bVar2 = false;
        if (iSignaledObjIndex < (int)lpHandles_local._4_4_) {
          bVar2 = ppIStack_158[iSignaledObjIndex] != (ISynchWaitController *)0x0;
        }
        if (!bVar2) break;
        (*ppIStack_158[iSignaledObjIndex]->_vptr_ISynchWaitController[3])();
        ppIStack_158[iSignaledObjIndex] = (ISynchWaitController *)0x0;
        iSignaledObjIndex = iSignaledObjIndex + 1;
      }
      iSignaledObjCount =
           (**(code **)(*g_pSynchronizationManager + 0x20))(g_pSynchronizationManager,pCStack_10);
      if (iSignaledObjCount == 0) {
        i = 0xc0;
      }
      else {
        fprintf(_stderr,"] %s %s:%d","InternalWaitForMultipleObjectsEx",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
                ,400);
        fprintf(_stderr,"Awakened for APC, but no APC is pending\n");
        CPalThread::SetLastError(0x54f);
        i = -1;
      }
    }
  }
  else {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    CPalThread::SetLastError(0x54f);
  }
LAB_003c7682:
  for (iSignaledObjIndex = 0; iSignaledObjIndex < (int)lpHandles_local._4_4_;
      iSignaledObjIndex = iSignaledObjIndex + 1) {
    (*ppISyncWaitCtrlrs[iSignaledObjIndex]->_vptr_ISynchWaitController[8])
              (ppISyncWaitCtrlrs[iSignaledObjIndex],pCStack_10);
    ppISyncWaitCtrlrs[iSignaledObjIndex] = (ISynchWaitController *)0x0;
  }
LAB_003c76ca:
  if (0x10 < lpHandles_local._4_4_) {
    InternalDeleteArray<CorUnix::IPalObject*>((IPalObject **)ppISyncWaitCtrlrs);
    InternalDeleteArray<CorUnix::ISynchWaitController*>(ppIStack_158);
  }
  return i;
}

Assistant:

DWORD CorUnix::InternalWaitForMultipleObjectsEx(
    CPalThread * pThread,
    DWORD nCount,
    CONST HANDLE *lpHandles,
    BOOL bWaitAll,
    DWORD dwMilliseconds,
    BOOL bAlertable)
{
    DWORD dwRet = WAIT_FAILED;
    PAL_ERROR palErr = NO_ERROR;
    int i, iSignaledObjCount, iSignaledObjIndex = -1;
    bool fWAll = (bool)bWaitAll, fNeedToBlock  = false;
    bool fAbandoned = false;
    WaitType wtWaitType;

    IPalObject            * pIPalObjStackArray[MAXIMUM_STACK_WAITOBJ_ARRAY_SIZE] = { NULL };
    ISynchWaitController  * pISyncStackArray[MAXIMUM_STACK_WAITOBJ_ARRAY_SIZE] = { NULL };
    IPalObject           ** ppIPalObjs = pIPalObjStackArray;
    ISynchWaitController ** ppISyncWaitCtrlrs = pISyncStackArray;

    if ((nCount == 0) || (nCount > MAXIMUM_WAIT_OBJECTS))
    {
        ppIPalObjs = NULL;        // make delete at the end safe
        ppISyncWaitCtrlrs = NULL; // make delete at the end safe
        ERROR("Invalid object count=%d [range: 1 to %d]\n",
               nCount, MAXIMUM_WAIT_OBJECTS);
        pThread->SetLastError(ERROR_INVALID_PARAMETER);
        goto WFMOExIntExit;
    }
    else if (nCount == 1)
    {
        fWAll = false;  // makes no difference when nCount is 1
        wtWaitType = SingleObject;
    }
    else
    {
        wtWaitType = fWAll ? MultipleObjectsWaitAll : MultipleObjectsWaitOne;
        if (nCount > MAXIMUM_STACK_WAITOBJ_ARRAY_SIZE)
        {
            ppIPalObjs = InternalNewArray<IPalObject*>(nCount);
            ppISyncWaitCtrlrs = InternalNewArray<ISynchWaitController*>(nCount);
            if ((NULL == ppIPalObjs) || (NULL == ppISyncWaitCtrlrs))
            {
                ERROR("Out of memory allocating internal structures\n");
                pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto WFMOExIntExit;
            }
        }
    }

    palErr = g_pObjectManager->ReferenceMultipleObjectsByHandleArray(pThread,
                                                                     (VOID **)lpHandles,
                                                                     nCount,
                                                                     &sg_aotWaitObject,
                                                                     SYNCHRONIZE,
                                                                     ppIPalObjs);
    if (NO_ERROR != palErr)
    {
        ERROR("Unable to obtain object for some or all of the handles [error=%u]\n",
              palErr);
        if (palErr == ERROR_INVALID_HANDLE)
            pThread->SetLastError(ERROR_INVALID_HANDLE);
        else
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
        goto WFMOExIntExit;
    }

    if (fWAll)
    {
        // For a wait-all operation, check for duplicate wait objects in the array. This just uses a brute-force O(n^2)
        // algorithm, but since MAXIMUM_WAIT_OBJECTS is small, the worst case is not so bad, and the average case would involve
        // significantly fewer items.
        for (DWORD i = 0; i < nCount - 1; ++i)
        {
            IPalObject *const objectToCheck = ppIPalObjs[i];
            for (DWORD j = i + 1; j < nCount; ++j)
            {
                if (ppIPalObjs[j] == objectToCheck)
                {
                    ERROR("Duplicate handle provided for a wait-all operation [error=%u]\n", ERROR_INVALID_PARAMETER);
                    pThread->SetLastError(ERROR_INVALID_PARAMETER);
                    goto WFMOExIntCleanup;
                }
            }
        }
    }

    palErr = g_pSynchronizationManager->GetSynchWaitControllersForObjects(
        pThread, ppIPalObjs, nCount, ppISyncWaitCtrlrs);
    if (NO_ERROR != palErr)
    {
        ERROR("Unable to obtain ISynchWaitController interface for some or all "
              "of the objects [error=%u]\n", palErr);
        pThread->SetLastError(ERROR_INTERNAL_ERROR);
        goto WFMOExIntCleanup;
    }

    if (bAlertable)
    {
        // First check for pending APC. We need to do that while holding the global
        // synch lock implicitely grabbed by GetSynchWaitControllersForObjects
        if (g_pSynchronizationManager->AreAPCsPending(pThread))
        {
            // If there is any pending APC we need to release the
            // implicit global synch lock before calling into it
            for (i = 0; (i < (int)nCount) && (NULL != ppISyncWaitCtrlrs[i]); i++)
            {
                ppISyncWaitCtrlrs[i]->ReleaseController();
                ppISyncWaitCtrlrs[i] = NULL;
            }
            palErr = g_pSynchronizationManager->DispatchPendingAPCs(pThread);
            if (NO_ERROR == palErr)
            {
                dwRet = WAIT_IO_COMPLETION;
            }
            else
            {
                ASSERT("Awakened for APC, but no APC is pending\n");
                pThread->SetLastError(ERROR_INTERNAL_ERROR);
                dwRet = WAIT_FAILED;
            }
            goto WFMOExIntCleanup;
        }
    }

    iSignaledObjCount = 0;
    iSignaledObjIndex = -1;
    for (i=0;i<(int)nCount;i++)
    {
        bool fValue;
        palErr = ppISyncWaitCtrlrs[i]->CanThreadWaitWithoutBlocking(&fValue, &fAbandoned);
        if (NO_ERROR != palErr)
        {
            ERROR("ISynchWaitController::CanThreadWaitWithoutBlocking() failed for "
                  "%d-th object [handle=%p error=%u]\n", i, lpHandles[i], palErr);
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
            goto WFMOExIntReleaseControllers;
        }
        if (fValue)
        {
            iSignaledObjCount++;
            iSignaledObjIndex = i;
            if (!fWAll)
                break;
        }
    }

    fNeedToBlock = (iSignaledObjCount == 0) || (fWAll && (iSignaledObjCount < (int)nCount));
    if (!fNeedToBlock)
    {
        // At least one object signaled, or bWaitAll==TRUE and all object signaled.
        // No need to wait, let's unsignal the object(s) and return without blocking
        int iStartIdx, iEndIdx;

        if (fWAll)
        {
            iStartIdx = 0;
            iEndIdx = nCount;
        }
        else
        {
            iStartIdx = iSignaledObjIndex;
            iEndIdx = iStartIdx + 1;
        }

        // Unsignal objects
        if( iStartIdx < 0 )
        {
            ERROR("Buffer underflow due to iStartIdx < 0");
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
            dwRet = WAIT_FAILED;
            goto WFMOExIntCleanup;
        }
        for (i = iStartIdx; i < iEndIdx; i++)
        {
            palErr = ppISyncWaitCtrlrs[i]->ReleaseWaitingThreadWithoutBlocking();
            if (NO_ERROR != palErr)
            {
                ERROR("ReleaseWaitingThreadWithoutBlocking() failed for %d-th "
                      "object [handle=%p error=%u]\n",
                      i, lpHandles[i], palErr);
                pThread->SetLastError(palErr);
                goto WFMOExIntReleaseControllers;
            }
        }

        dwRet = (fAbandoned ? WAIT_ABANDONED_0 : WAIT_OBJECT_0);
    }
    else if (0 == dwMilliseconds)
    {
        // Not enough objects signaled, but timeout is zero: no actual wait
        dwRet = WAIT_TIMEOUT;
        fNeedToBlock = false;
    }
    else
    {
        // Register the thread for waiting on all objects
        for (i=0;i<(int)nCount;i++)
        {
            palErr = ppISyncWaitCtrlrs[i]->RegisterWaitingThread(
                                                        wtWaitType,
                                                        i,
                                                        (TRUE == bAlertable));
            if (NO_ERROR != palErr)
            {
                ERROR("RegisterWaitingThread() failed for %d-th object "
                      "[handle=%p error=%u]\n", i, lpHandles[i], palErr);
                pThread->SetLastError(palErr);
                goto WFMOExIntReleaseControllers;
            }
        }
    }

WFMOExIntReleaseControllers:
    // Release all controllers before going to sleep
    for (i = 0; i < (int)nCount; i++)
    {
        ppISyncWaitCtrlrs[i]->ReleaseController();
        ppISyncWaitCtrlrs[i] = NULL;
    }
    if (NO_ERROR != palErr)
        goto WFMOExIntCleanup;

    if (fNeedToBlock)
    {
        ThreadWakeupReason twrWakeupReason;

        //
        // Going to sleep
        //
        palErr = g_pSynchronizationManager->BlockThread(pThread,
                                                        dwMilliseconds,
                                                        (TRUE == bAlertable),
                                                        false,
                                                        &twrWakeupReason,
                                                        (DWORD *)&iSignaledObjIndex);
        //
        // Awakened
        //
        if (NO_ERROR != palErr)
        {
            ERROR("IPalSynchronizationManager::BlockThread failed for thread "
                  "pThread=%p [error=%u]\n", pThread, palErr);
            pThread->SetLastError(palErr);
            goto WFMOExIntCleanup;
        }
        switch (twrWakeupReason)
        {
        case WaitSucceeded:
            dwRet = WAIT_OBJECT_0; // offset added later
            break;
        case MutexAbondoned:
            dwRet =  WAIT_ABANDONED_0; // offset added later
            break;
        case WaitTimeout:
            dwRet = WAIT_TIMEOUT;
            break;
        case Alerted:
            _ASSERT_MSG(bAlertable,
                        "Awakened for APC from a non-alertable wait\n");

            dwRet = WAIT_IO_COMPLETION;
            palErr = g_pSynchronizationManager->DispatchPendingAPCs(pThread);

            _ASSERT_MSG(NO_ERROR == palErr,
                        "Awakened for APC, but no APC is pending\n");
            break;
        case WaitFailed:
        default:
            ERROR("Thread %p awakened with some failure\n", pThread);
            dwRet = WAIT_FAILED;
            break;
        }
    }

    if (!fWAll && ((WAIT_OBJECT_0 == dwRet) || (WAIT_ABANDONED_0 == dwRet)))
    {
        _ASSERT_MSG(0 <= iSignaledObjIndex,
                    "Failed to identify signaled/abandoned object\n");
        _ASSERT_MSG(iSignaledObjIndex >= 0 && nCount > static_cast<DWORD>(iSignaledObjIndex),
                    "SignaledObjIndex object out of range "
                    "[index=%d obj_count=%u\n",
                    iSignaledObjCount, nCount);

        if (iSignaledObjIndex < 0)
        {
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
            dwRet = WAIT_FAILED;
            goto WFMOExIntCleanup;
        }
        dwRet += iSignaledObjIndex;
    }

WFMOExIntCleanup:
    for (i = 0; i < (int)nCount; i++)
    {
        ppIPalObjs[i]->ReleaseReference(pThread);
        ppIPalObjs[i] = NULL;
    }

WFMOExIntExit:
    if (nCount > MAXIMUM_STACK_WAITOBJ_ARRAY_SIZE)
    {
        InternalDeleteArray(ppIPalObjs);
        InternalDeleteArray(ppISyncWaitCtrlrs);
    }

    return dwRet;
}